

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertToLHProcess.cpp
# Opt level: O2

void Assimp::FlipWindingOrderProcess::ProcessMesh(aiMesh *pMesh)

{
  undefined8 *puVar1;
  float fVar2;
  aiFace *paVar3;
  uint *puVar4;
  aiAnimMesh *paVar5;
  aiVector3D *paVar6;
  undefined8 uVar7;
  aiColor4D *paVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  uint a;
  ulong uVar11;
  int iVar12;
  uint b;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  
  for (uVar11 = 0; uVar11 < pMesh->mNumFaces; uVar11 = uVar11 + 1) {
    paVar3 = pMesh->mFaces;
    iVar12 = -1;
    uVar14 = 0;
    while( true ) {
      uVar15 = paVar3[uVar11].mNumIndices;
      if (uVar15 >> 1 <= uVar14) break;
      puVar4 = paVar3[uVar11].mIndices;
      uVar15 = uVar15 + iVar12;
      uVar13 = puVar4[uVar14];
      puVar4[uVar14] = puVar4[uVar15];
      puVar4[uVar15] = uVar13;
      uVar14 = uVar14 + 1;
      iVar12 = iVar12 + -1;
    }
  }
  for (uVar11 = 0; uVar11 < pMesh->mNumAnimMeshes; uVar11 = uVar11 + 1) {
    paVar5 = pMesh->mAnimMeshes[uVar11];
    uVar15 = paVar5->mNumVertices;
    uVar14 = (ulong)uVar15;
    if (paVar5->mVertices != (aiVector3D *)0x0) {
      uVar13 = uVar15;
      for (lVar16 = 0; uVar13 = uVar13 - 1, uVar14 * 0xc - lVar16 != 0; lVar16 = lVar16 + 0xc) {
        paVar6 = paVar5->mVertices;
        fVar2 = *(float *)((long)&paVar6->z + lVar16);
        uVar7 = *(undefined8 *)((long)&paVar6->x + lVar16);
        *(float *)((long)&paVar6->z + lVar16) = paVar6[uVar13].z;
        *(undefined8 *)((long)&paVar6->x + lVar16) = *(undefined8 *)(paVar6 + uVar13);
        paVar6[uVar13].z = fVar2;
        paVar6[uVar13].x = (float)(int)uVar7;
        paVar6[uVar13].y = (float)(int)((ulong)uVar7 >> 0x20);
      }
    }
    if (paVar5->mNormals != (aiVector3D *)0x0) {
      uVar13 = uVar15;
      for (lVar16 = 0; uVar13 = uVar13 - 1, uVar14 * 0xc - lVar16 != 0; lVar16 = lVar16 + 0xc) {
        paVar6 = paVar5->mNormals;
        fVar2 = *(float *)((long)&paVar6->z + lVar16);
        uVar7 = *(undefined8 *)((long)&paVar6->x + lVar16);
        *(float *)((long)&paVar6->z + lVar16) = paVar6[uVar13].z;
        *(undefined8 *)((long)&paVar6->x + lVar16) = *(undefined8 *)(paVar6 + uVar13);
        paVar6[uVar13].z = fVar2;
        paVar6[uVar13].x = (float)(int)uVar7;
        paVar6[uVar13].y = (float)(int)((ulong)uVar7 >> 0x20);
      }
    }
    uVar15 = uVar15 - 1;
    for (lVar16 = 0; lVar16 != 8; lVar16 = lVar16 + 1) {
      if (paVar5->mTextureCoords[lVar16] != (aiVector3D *)0x0) {
        uVar13 = uVar15;
        for (lVar17 = 0; uVar14 * 0xc - lVar17 != 0; lVar17 = lVar17 + 0xc) {
          paVar6 = paVar5->mTextureCoords[lVar16];
          fVar2 = *(float *)((long)&paVar6->z + lVar17);
          uVar7 = *(undefined8 *)((long)&paVar6->x + lVar17);
          *(float *)((long)&paVar6->z + lVar17) = paVar6[uVar13].z;
          *(undefined8 *)((long)&paVar6->x + lVar17) = *(undefined8 *)(paVar6 + uVar13);
          paVar6[uVar13].z = fVar2;
          paVar6[uVar13].x = (float)(int)uVar7;
          paVar6[uVar13].y = (float)(int)((ulong)uVar7 >> 0x20);
          uVar13 = uVar13 - 1;
        }
      }
    }
    if (paVar5->mTangents != (aiVector3D *)0x0) {
      uVar13 = uVar15;
      for (lVar16 = 0; uVar14 * 0xc - lVar16 != 0; lVar16 = lVar16 + 0xc) {
        paVar6 = paVar5->mTangents;
        fVar2 = *(float *)((long)&paVar6->z + lVar16);
        uVar7 = *(undefined8 *)((long)&paVar6->x + lVar16);
        *(float *)((long)&paVar6->z + lVar16) = paVar6[uVar13].z;
        *(undefined8 *)((long)&paVar6->x + lVar16) = *(undefined8 *)(paVar6 + uVar13);
        paVar6[uVar13].z = fVar2;
        paVar6[uVar13].x = (float)(int)uVar7;
        paVar6[uVar13].y = (float)(int)((ulong)uVar7 >> 0x20);
        paVar6 = paVar5->mBitangents;
        fVar2 = *(float *)((long)&paVar6->z + lVar16);
        uVar7 = *(undefined8 *)((long)&paVar6->x + lVar16);
        *(float *)((long)&paVar6->z + lVar16) = paVar6[uVar13].z;
        *(undefined8 *)((long)&paVar6->x + lVar16) = *(undefined8 *)(paVar6 + uVar13);
        paVar6[uVar13].z = fVar2;
        paVar6[uVar13].x = (float)(int)uVar7;
        paVar6[uVar13].y = (float)(int)((ulong)uVar7 >> 0x20);
        uVar13 = uVar13 - 1;
      }
    }
    for (lVar16 = 0; lVar16 != 8; lVar16 = lVar16 + 1) {
      if (paVar5->mColors[lVar16] != (aiColor4D *)0x0) {
        uVar13 = uVar15;
        for (lVar17 = 0; uVar14 << 4 != lVar17; lVar17 = lVar17 + 0x10) {
          paVar8 = paVar5->mColors[lVar16];
          puVar1 = (undefined8 *)((long)&paVar8->r + lVar17);
          uVar7 = *puVar1;
          uVar9 = puVar1[1];
          uVar10 = *(undefined8 *)&paVar8[uVar13].b;
          puVar1 = (undefined8 *)((long)&paVar8->r + lVar17);
          *puVar1 = *(undefined8 *)(paVar8 + uVar13);
          puVar1[1] = uVar10;
          paVar8 = paVar8 + uVar13;
          paVar8->r = (float)(int)uVar7;
          paVar8->g = (float)(int)((ulong)uVar7 >> 0x20);
          paVar8->b = (float)(int)uVar9;
          paVar8->a = (float)(int)((ulong)uVar9 >> 0x20);
          uVar13 = uVar13 - 1;
        }
      }
    }
  }
  return;
}

Assistant:

void FlipWindingOrderProcess::ProcessMesh( aiMesh* pMesh)
{
    // invert the order of all faces in this mesh
    for( unsigned int a = 0; a < pMesh->mNumFaces; a++)
    {
        aiFace& face = pMesh->mFaces[a];
        for (unsigned int b = 0; b < face.mNumIndices / 2; b++) {
            std::swap(face.mIndices[b], face.mIndices[face.mNumIndices - 1 - b]);
        }
    }

    // invert the order of all components in this mesh anim meshes
    for (unsigned int m = 0; m < pMesh->mNumAnimMeshes; m++) {
        aiAnimMesh* animMesh = pMesh->mAnimMeshes[m];
        unsigned int numVertices = animMesh->mNumVertices;
        if (animMesh->HasPositions()) {
            for (unsigned int a = 0; a < numVertices; a++)
            {
                std::swap(animMesh->mVertices[a], animMesh->mVertices[numVertices - 1 - a]);
            }
        }
        if (animMesh->HasNormals()) {
            for (unsigned int a = 0; a < numVertices; a++)
            {
                std::swap(animMesh->mNormals[a], animMesh->mNormals[numVertices - 1 - a]);
            }
        }
        for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; i++) {
            if (animMesh->HasTextureCoords(i)) {
                for (unsigned int a = 0; a < numVertices; a++)
                {
                    std::swap(animMesh->mTextureCoords[i][a], animMesh->mTextureCoords[i][numVertices - 1 - a]);
                }
            }
        }
        if (animMesh->HasTangentsAndBitangents()) {
            for (unsigned int a = 0; a < numVertices; a++)
            {
                std::swap(animMesh->mTangents[a], animMesh->mTangents[numVertices - 1 - a]);
                std::swap(animMesh->mBitangents[a], animMesh->mBitangents[numVertices - 1 - a]);
            }
        }
        for (unsigned int v = 0; v < AI_MAX_NUMBER_OF_COLOR_SETS; v++) {
            if (animMesh->HasVertexColors(v)) {
                for (unsigned int a = 0; a < numVertices; a++)
                {
                    std::swap(animMesh->mColors[v][a], animMesh->mColors[v][numVertices - 1 - a]);
                }
            }
        }
    }
}